

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfig.h
# Opt level: O0

void __thiscall
TidyConfig::
visitConfig<TidyConfigParser::setCheckConfig(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)::__0>
          (TidyConfig *this,string *configName,anon_class_24_3_d94fd32e visit)

{
  bool bVar1;
  invalid_argument *this_00;
  anon_class_24_3_d94fd32e *in_RSI;
  value<fmt::v11::context> *in_RDI;
  undefined1 in_stack_00000170 [16];
  undefined1 in_stack_00000180 [16];
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  undefined8 in_stack_ffffffffffffff40;
  flag_type __f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined1 *local_50;
  char *local_48;
  undefined8 uStack_40;
  char *local_28;
  undefined8 uStack_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  __f = (flag_type)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stack0x00000008;
  bVar1 = std::operator==(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
  if (bVar1) {
    TidyConfigParser::
    setCheckConfig(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)
    ::$_0::operator()(in_RSI,in_stack_ffffffffffffff80);
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
    if (bVar1) {
      TidyConfigParser::
      setCheckConfig(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)
      ::$_0::operator()(in_RSI,in_stack_ffffffffffffff80);
    }
    else {
      bVar1 = std::operator==(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
      if (bVar1) {
        TidyConfigParser::
        setCheckConfig(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)
        ::$_0::operator()(in_RSI,in_stack_ffffffffffffff80);
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,__f);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::operator=
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_ffffffffffffff10
                   ,in_stack_ffffffffffffff08);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_ffffffffffffff10
                  );
      }
      else {
        bVar1 = std::operator==(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
        if (bVar1) {
          TidyConfigParser::
          setCheckConfig(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)
          ::$_0::operator()(in_RSI,(bool *)in_stack_ffffffffffffff80);
        }
        else {
          bVar1 = std::operator==(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
          if (bVar1) {
            TidyConfigParser::
            setCheckConfig(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)
            ::$_0::operator()((anon_class_24_3_d94fd32e *)in_stack_ffffffffffffff10,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_ffffffffffffff08);
          }
          else {
            bVar1 = std::operator==(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
            if (bVar1) {
              TidyConfigParser::
              setCheckConfig(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)
              ::$_0::operator()((anon_class_24_3_d94fd32e *)in_stack_ffffffffffffff10,
                                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_ffffffffffffff08);
            }
            else {
              bVar1 = std::operator==(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08);
              if (bVar1) {
                TidyConfigParser::
                setCheckConfig(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)
                ::$_0::operator()((anon_class_24_3_d94fd32e *)in_stack_ffffffffffffff10,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)in_stack_ffffffffffffff08);
              }
              else {
                bVar1 = std::operator==(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08)
                ;
                if (!bVar1) {
                  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
                  local_18 = &stack0xffffffffffffff48;
                  local_28 = "The check: {} does not exist";
                  uStack_20 = 0x1c;
                  local_48 = "The check: {} does not exist";
                  uStack_40 = 0x1c;
                  ::fmt::v11::detail::value<fmt::v11::context>::
                  value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                            (in_RDI,x);
                  local_8 = &local_58;
                  local_10 = local_68;
                  local_58 = 0xd;
                  local_50 = local_10;
                  ::fmt::v11::vformat_abi_cxx11_
                            ((string_view)in_stack_00000180,(format_args)in_stack_00000170);
                  std::invalid_argument::invalid_argument
                            (this_00,(string *)&stack0xffffffffffffff48);
                  __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                              std::invalid_argument::~invalid_argument);
                }
                TidyConfigParser::
                setCheckConfig(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)
                ::$_0::operator()(in_RSI,in_stack_ffffffffffffff80);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void visitConfig(std::string const& configName, Visitor visit) {
        if (configName == "clkName") {
            visit(checkConfigs.clkName);
            return;
        }
        else if (configName == "resetName") {
            visit(checkConfigs.resetName);
            return;
        }
        else if (configName == "clkNameRegexString") {
            visit(checkConfigs.clkNameRegexString);
            checkConfigs.clkNameRegexPattern = std::regex(checkConfigs.clkNameRegexString);
            return;
        }
        else if (configName == "resetIsActiveHigh") {
            visit(checkConfigs.resetIsActiveHigh);
            return;
        }
        else if (configName == "inputPortSuffix") {
            visit(checkConfigs.inputPortSuffix);
            return;
        }
        else if (configName == "outputPortSuffix") {
            visit(checkConfigs.outputPortSuffix);
            return;
        }
        else if (configName == "inoutPortSuffix") {
            visit(checkConfigs.inoutPortSuffix);
            return;
        }
        else if (configName == "moduleInstantiationPrefix") {
            visit(checkConfigs.moduleInstantiationPrefix);
            return;
        }
        SLANG_THROW(std::invalid_argument(fmt::format("The check: {} does not exist", configName)));
    }